

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true> __thiscall
duckdb::Binder::BindMaterializedCTE(Binder *this,CommonTableExpressionMap *cte_map)

{
  pointer puVar1;
  unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
  *this_00;
  case_insensitive_map_t<idx_t> *this_01;
  pointer ppVar2;
  _Head_base<0UL,_duckdb::CTENode_*,_false> _Var3;
  pointer ppVar4;
  Binder *statement;
  pointer pCVar5;
  QueryNode *pQVar6;
  pointer pCVar7;
  pointer pSVar8;
  pointer pQVar9;
  reference pvVar10;
  CommonTableExpressionMap *in_RDX;
  _Head_base<0UL,_duckdb::BoundCTENode_*,_false> this_02;
  pointer *__ptr_1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var11;
  pointer __p;
  pointer ppVar12;
  pointer *__ptr;
  unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> node_result;
  unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> cte_root;
  vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_true>
  materialized_ctes;
  unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true> *bound_cte;
  templated_unique_single_t mat_cte;
  _Head_base<0UL,_duckdb::CTENode_*,_false> local_e8;
  _Head_base<0UL,_duckdb::CTENode_*,_false> local_e0;
  vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  local_d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
  local_b8;
  _Head_base<0UL,_duckdb::BoundCTENode_*,_false> local_a0;
  CommonTableExpressionMap *local_98;
  Binder *local_90;
  CommonTableExpressionMap local_88;
  
  local_d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar12 = (in_RDX->map).map.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (in_RDX->map).map.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a0._M_head_impl = (BoundCTENode *)this;
  local_98 = in_RDX;
  local_90 = (Binder *)cte_map;
  if (ppVar12 != ppVar2) {
    do {
      this_00 = &ppVar12->second;
      pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
               ::operator->(this_00);
      if (pCVar5->materialized == CTE_MATERIALIZE_ALWAYS) {
        pQVar6 = (QueryNode *)operator_new(0xc0);
        QueryNode::QueryNode(pQVar6,CTE_NODE);
        pQVar6->_vptr_QueryNode = (_func_int **)&PTR__CTENode_0247e2c8;
        pQVar6[1]._vptr_QueryNode = (_func_int **)&pQVar6[1].modifiers;
        *(undefined8 *)&pQVar6[1].type = 0;
        *(undefined1 *)
         &pQVar6[1].modifiers.
          super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = 0;
        pQVar6[1].modifiers.
        super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pQVar6[1].cte_map.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pQVar6[1].cte_map.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pQVar6[1].cte_map.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pQVar6[1].cte_map.map.map_idx._M_h._M_buckets = (__buckets_ptr)0x0;
        local_88.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pQVar6;
        pCVar7 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                           ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>
                             *)&local_88);
        ::std::__cxx11::string::_M_assign((string *)&pCVar7->ctename);
        pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->(this_00);
        pSVar8 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                 ::operator->(&pCVar5->query);
        pQVar9 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                 operator->(&pSVar8->node);
        (*pQVar9->_vptr_QueryNode[5])(&local_b8,pQVar9);
        pCVar7 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                           ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>
                             *)&local_88);
        ppVar4 = local_b8.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_b8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        _Var11._M_head_impl =
             (pCVar7->query).
             super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
             super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
        (pCVar7->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
        ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)ppVar4;
        if (_Var11._M_head_impl != (QueryNode *)0x0) {
          (**(code **)((long)(_Var11._M_head_impl)->_vptr_QueryNode + 8))();
        }
        if ((QueryNode *)
            local_b8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (QueryNode *)0x0) {
          (*(*(_func_int ***)
              &(local_b8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first)[1])();
        }
        pCVar5 = unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>
                 ::operator->(this_00);
        pCVar7 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                           ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>
                             *)&local_88);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&pCVar7->aliases,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pCVar5);
        ::std::
        vector<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>,std::allocator<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>,std::allocator<duckdb::unique_ptr<duckdb::CTENode,std::default_delete<duckdb::CTENode>,true>>>
                    *)&local_d8,
                   (unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *)
                   &local_88);
        if ((QueryNode *)
            local_88.map.map.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (QueryNode *)0x0) {
          (*(*(_func_int ***)
              &(local_88.map.map.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first)[1])();
        }
      }
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 != ppVar2);
  }
  if (local_d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ((local_a0._M_head_impl)->super_BoundQueryNode)._vptr_BoundQueryNode = (_func_int **)0x0;
    this_02._M_head_impl = local_a0._M_head_impl;
  }
  else {
    local_e0._M_head_impl = (CTENode *)0x0;
    if (local_d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_01 = &local_88.map.map_idx;
      do {
        local_e8._M_head_impl = (CTENode *)0x0;
        pvVar10 = vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_true>
                  ::back((vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_true>
                          *)&local_d8);
        _Var3._M_head_impl =
             (pvVar10->super_unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>).
             _M_t.super___uniq_ptr_impl<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>._M_t
             .super__Tuple_impl<0UL,_duckdb::CTENode_*,_std::default_delete<duckdb::CTENode>_>.
             super__Head_base<0UL,_duckdb::CTENode_*,_false>._M_head_impl;
        (pvVar10->super_unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>)._M_t.
        super___uniq_ptr_impl<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::CTENode_*,_std::default_delete<duckdb::CTENode>_>.
        super__Head_base<0UL,_duckdb::CTENode_*,_false>._M_head_impl = (CTENode *)0x0;
        if (local_e8._M_head_impl != (CTENode *)0x0) {
          pQVar6 = &(local_e8._M_head_impl)->super_QueryNode;
          local_e8._M_head_impl = _Var3._M_head_impl;
          (*pQVar6->_vptr_QueryNode[1])();
          _Var3._M_head_impl = local_e8._M_head_impl;
        }
        local_e8._M_head_impl = _Var3._M_head_impl;
        CommonTableExpressionMap::Copy(&local_88,local_98);
        pCVar7 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                           ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>
                             *)&local_e8);
        local_b8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pCVar7->super_QueryNode).cte_map.map.map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_b8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pCVar7->super_QueryNode).cte_map.map.map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_b8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pCVar7->super_QueryNode).cte_map.map.map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pCVar7->super_QueryNode).cte_map.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_88.map.map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pCVar7->super_QueryNode).cte_map.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_88.map.map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pCVar7->super_QueryNode).cte_map.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_88.map.map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_88.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.map.map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ::~vector(&local_b8);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign(&(pCVar7->super_QueryNode).cte_map.map.map_idx._M_h,this_01);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&this_01->_M_h);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
                   *)&local_88);
        _Var3._M_head_impl = local_e0._M_head_impl;
        if (local_e0._M_head_impl == (CTENode *)0x0) {
          pCVar7 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::
                   operator->((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>
                               *)&local_e8);
          _Var11._M_head_impl =
               (pCVar7->child).
               super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
               super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
               super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
          (pCVar7->child).
          super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
          super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
          super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
        }
        else {
          local_e0._M_head_impl = (CTENode *)0x0;
          pCVar7 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::
                   operator->((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>
                               *)&local_e8);
          _Var11._M_head_impl =
               (pCVar7->child).
               super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
               super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
               super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
          (pCVar7->child).
          super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
          super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
          super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
               &(_Var3._M_head_impl)->super_QueryNode;
        }
        if (_Var11._M_head_impl != (QueryNode *)0x0) {
          (*(_Var11._M_head_impl)->_vptr_QueryNode[1])();
        }
        _Var3._M_head_impl = local_e0._M_head_impl;
        local_e0._M_head_impl = local_e8._M_head_impl;
        local_e8._M_head_impl = (CTENode *)0x0;
        if (_Var3._M_head_impl != (CTENode *)0x0) {
          (*((_Var3._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
        }
        puVar1 = local_d8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        _Var3._M_head_impl =
             local_d8.
             super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super_unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>._M_t.
             super___uniq_ptr_impl<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::CTENode_*,_std::default_delete<duckdb::CTENode>_>.
             super__Head_base<0UL,_duckdb::CTENode_*,_false>._M_head_impl;
        local_d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar1;
        if (_Var3._M_head_impl != (CTENode *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_QueryNode + 8))();
        }
        (puVar1->super_unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>)._M_t.
        super___uniq_ptr_impl<duckdb::CTENode,_std::default_delete<duckdb::CTENode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::CTENode_*,_std::default_delete<duckdb::CTENode>_>.
        super__Head_base<0UL,_duckdb::CTENode_*,_false>._M_head_impl = (CTENode *)0x0;
        if (local_e8._M_head_impl != (CTENode *)0x0) {
          (*((local_e8._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
        }
      } while (local_d8.
               super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_d8.
               super__Vector_base<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    statement = local_90;
    AddCTEMap(local_90,local_98);
    this_02._M_head_impl = local_a0._M_head_impl;
    pCVar7 = unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>::operator->
                       ((unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true> *)
                        &local_e0);
    QueryNode::Cast<duckdb::CTENode>(&pCVar7->super_QueryNode);
    BindCTE((Binder *)this_02._M_head_impl,(CTENode *)statement);
    if (local_e0._M_head_impl != (CTENode *)0x0) {
      (*((local_e0._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  ::~vector(&local_d8);
  return (unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>_>)
         (__uniq_ptr_impl<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>_>)
         this_02._M_head_impl;
}

Assistant:

unique_ptr<BoundCTENode> Binder::BindMaterializedCTE(CommonTableExpressionMap &cte_map) {
	// Extract materialized CTEs from cte_map
	vector<unique_ptr<CTENode>> materialized_ctes;
	for (auto &cte : cte_map.map) {
		auto &cte_entry = cte.second;
		if (cte_entry->materialized == CTEMaterialize::CTE_MATERIALIZE_ALWAYS) {
			auto mat_cte = make_uniq<CTENode>();
			mat_cte->ctename = cte.first;
			mat_cte->query = cte_entry->query->node->Copy();
			mat_cte->aliases = cte_entry->aliases;
			materialized_ctes.push_back(std::move(mat_cte));
		}
	}

	if (materialized_ctes.empty()) {
		return nullptr;
	}

	unique_ptr<CTENode> cte_root = nullptr;
	while (!materialized_ctes.empty()) {
		unique_ptr<CTENode> node_result;
		node_result = std::move(materialized_ctes.back());
		node_result->cte_map = cte_map.Copy();
		if (cte_root) {
			node_result->child = std::move(cte_root);
		} else {
			node_result->child = nullptr;
		}
		cte_root = std::move(node_result);
		materialized_ctes.pop_back();
	}

	AddCTEMap(cte_map);
	auto bound_cte = BindCTE(cte_root->Cast<CTENode>());

	return bound_cte;
}